

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.h
# Opt level: O0

unsigned_short * lzham::lzham_new_array<unsigned_short>(lzham_malloc_context context,uint32 num)

{
  void *pvVar1;
  uint in_ESI;
  size_t in_RDI;
  unsigned_short *p;
  uint8 *q;
  undefined4 in_stack_ffffffffffffffe8;
  lzham_malloc_context in_stack_fffffffffffffff8;
  unsigned_short *puVar2;
  
  if (in_ESI == 0) {
    in_ESI = 1;
  }
  pvVar1 = lzham_malloc(in_stack_fffffffffffffff8,in_RDI,
                        (size_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
  if (pvVar1 == (void *)0x0) {
    puVar2 = (unsigned_short *)0x0;
  }
  else {
    puVar2 = (unsigned_short *)((long)pvVar1 + 0x10);
    *(uint *)((long)pvVar1 + 0xc) = in_ESI;
    *(uint *)((long)pvVar1 + 8) = in_ESI ^ 0xffffffff;
  }
  return puVar2;
}

Assistant:

inline T* lzham_new_array(lzham_malloc_context context, uint32 num)
   {
      if (!num) num = 1;

      uint8* q = static_cast<uint8*>(lzham_malloc(context, LZHAM_MIN_ALLOC_ALIGNMENT + sizeof(T) * num));
      if (!q)
         return NULL;

      T* p = reinterpret_cast<T*>(q + LZHAM_MIN_ALLOC_ALIGNMENT);

      reinterpret_cast<uint32*>(p)[-1] = num;
      reinterpret_cast<uint32*>(p)[-2] = ~num;

      if (!LZHAM_IS_SCALAR_TYPE(T))
      {
         helpers::construct_array(p, num);
      }
      return p;
   }